

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageinput.cc
# Opt level: O2

void __thiscall ImageInput::fwarning(ImageInput *this,string *wmsg)

{
  string fwmsg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  std::operator+(&bStack_38,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &this->_filename,": ");
  std::__cxx11::string::append((string *)&bStack_38);
  warning(this,(string *)&bStack_38);
  std::__cxx11::string::~string((string *)&bStack_38);
  return;
}

Assistant:

void ImageInput::fwarning(const std::string& wmsg)
{
    std::string fwmsg = _filename + ": ";
    fwmsg += wmsg;
    warning(fwmsg);
}